

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void __thiscall gguf_writer::write<unsigned_int>(gguf_writer *this,uint *val)

{
  size_t i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<signed_char,_std::allocator<signed_char>_>::push_back
              (this->buf,(value_type_conflict3 *)((long)val + lVar1));
  }
  return;
}

Assistant:

void write(const T & val) const {
        for (size_t i = 0; i < sizeof(val); ++i) {
            buf.push_back(reinterpret_cast<const int8_t *>(&val)[i]);
        }
    }